

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QTzTimeZoneCacheEntry * __thiscall
QTzTimeZoneCache::fetchEntry
          (QTzTimeZoneCacheEntry *__return_storage_ptr__,QTzTimeZoneCache *this,QByteArray *ianaId)

{
  QMutex *this_00;
  __single_object object;
  QTzTimeZoneCacheEntry *pQVar1;
  long in_FS_OFFSET;
  __single_object ptr;
  undefined1 local_40 [16];
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_mutex;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = this_00;
  QBasicMutex::lock(&this_00->super_QBasicMutex);
  local_40[8] = true;
  pQVar1 = QCache<QByteArray,_QTzTimeZoneCacheEntry>::relink(&this->m_cache,ianaId);
  if (pQVar1 == (QTzTimeZoneCacheEntry *)0x0) {
    QBasicMutex::unlock(&this_00->super_QBasicMutex);
    local_40[8] = false;
    *(undefined1 **)&__return_storage_ptr__->m_preZoneRule = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->m_preZoneRule).abbreviationIndex =
         &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_posixRule).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_posixRule).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_abbreviations).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_posixRule).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_abbreviations).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_abbreviations).d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranRules).d.ptr = (QTzTransitionRule *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranRules).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranTimes).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranRules).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranTimes).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m_tranTimes).d.ptr = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    findEntry(__return_storage_ptr__,ianaId);
    ptr._M_t.
    super___uniq_ptr_impl<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>._M_t.
    super__Tuple_impl<0UL,_QTzTimeZoneCacheEntry_*,_std::default_delete<QTzTimeZoneCacheEntry>_>.
    super__Head_base<0UL,_QTzTimeZoneCacheEntry_*,_false>._M_head_impl =
         (__uniq_ptr_data<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>,_true,_true>
          )&DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QTzTimeZoneCacheEntry,QTzTimeZoneCacheEntry&>((QTzTimeZoneCacheEntry *)&ptr);
    QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
    object = ptr;
    local_40[8] = true;
    ptr._M_t.
    super___uniq_ptr_impl<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>._M_t.
    super__Tuple_impl<0UL,_QTzTimeZoneCacheEntry_*,_std::default_delete<QTzTimeZoneCacheEntry>_>.
    super__Head_base<0UL,_QTzTimeZoneCacheEntry_*,_false>._M_head_impl =
         (__uniq_ptr_data<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>,_true,_true>
          )(__uniq_ptr_impl<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>)0x0;
    QCache<QByteArray,_QTzTimeZoneCacheEntry>::insert
              (&this->m_cache,ianaId,
               (QTzTimeZoneCacheEntry *)
               object._M_t.
               super___uniq_ptr_impl<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTzTimeZoneCacheEntry_*,_std::default_delete<QTzTimeZoneCacheEntry>_>
               .super__Head_base<0UL,_QTzTimeZoneCacheEntry_*,_false>._M_head_impl,1);
    QBasicMutex::unlock((QBasicMutex *)local_40._0_8_);
    local_40[8] = false;
    std::unique_ptr<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>::~unique_ptr
              (&ptr);
  }
  else {
    QTzTimeZoneCacheEntry::QTzTimeZoneCacheEntry(__return_storage_ptr__,pQVar1);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::fetchEntry(const QByteArray &ianaId)
{
    QMutexLocker locker(&m_mutex);

    // search the cache...
    QTzTimeZoneCacheEntry *obj = m_cache.object(ianaId);
    if (obj)
        return *obj;

    // ... or build a new entry from scratch

    locker.unlock(); // don't parse files under mutex lock

    QTzTimeZoneCacheEntry ret = findEntry(ianaId);
    auto ptr = std::make_unique<QTzTimeZoneCacheEntry>(ret);

    locker.relock();
    m_cache.insert(ianaId, ptr.release()); // may overwrite if another thread was faster
    locker.unlock();

    return ret;
}